

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O0

int fixed_mmu_map_address_mips
              (CPUMIPSState *env,hwaddr *physical,int *prot,target_ulong_conflict address,int rw,
              int access_type)

{
  int access_type_local;
  int rw_local;
  target_ulong_conflict address_local;
  int *prot_local;
  hwaddr *physical_local;
  CPUMIPSState *env_local;
  
  if (address < 0x80000000) {
    if ((env->CP0_Status & 4U) == 0) {
      *physical = (ulong)address + 0x40000000;
    }
    else {
      *physical = (ulong)address;
    }
  }
  else if (address < 0xc0000000) {
    *physical = (ulong)(address & 0x1fffffff);
  }
  else {
    *physical = (ulong)address;
  }
  *prot = 7;
  return 0;
}

Assistant:

int fixed_mmu_map_address(CPUMIPSState *env, hwaddr *physical, int *prot,
                          target_ulong address, int rw, int access_type)
{
    if (address <= (int32_t)0x7FFFFFFFUL) {
        if (!(env->CP0_Status & (1 << CP0St_ERL))) {
            *physical = address + 0x40000000UL;
        } else {
            *physical = address;
        }
    } else if (address <= (int32_t)0xBFFFFFFFUL) {
        *physical = address & 0x1FFFFFFF;
    } else {
        *physical = address;
    }

    *prot = PAGE_READ | PAGE_WRITE | PAGE_EXEC;
    return TLBRET_MATCH;
}